

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField64.c
# Opt level: O3

void Hacl_GenericField64_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *aM,uint32_t bBits,
               uint64_t *b,uint64_t *resM)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  uint64_t *puVar4;
  byte bVar5;
  sbyte sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t *puVar13;
  uint64_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint64_t *puVar17;
  uint uVar18;
  uint64_t auStack_e0 [2];
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  uint64_t *local_b8;
  uint64_t *t11_3;
  uint64_t *t11_2;
  uint64_t *t11_1;
  uint64_t *local_98;
  uint64_t *ctx_r2;
  ulong local_88;
  uint64_t *local_80;
  uint64_t *t11;
  ulong local_70;
  uint64_t *local_68;
  uint64_t *local_60;
  uint64_t *local_58;
  uint64_t *ctx_n;
  uint64_t *local_48;
  uint64_t local_40;
  uint64_t *local_38;
  uint64_t *ctx_n0;
  
  uVar18 = k->len;
  uVar8 = (ulong)uVar18;
  ctx_n = k->n;
  uVar14 = k->mu;
  local_38 = k->r2;
  uVar9 = uVar8 * 8 + 0xf & 0xfffffffffffffff0;
  puVar10 = (uint64_t *)((long)auStack_e0 + -uVar9 + 8);
  __n = uVar8 * 8;
  ctx_r2 = b;
  local_60 = resM;
  local_48 = puVar10;
  *(undefined8 *)((long)auStack_e0 + -uVar9) = 0x19714a;
  memcpy(puVar10,aM,__n);
  local_70 = (ulong)bBits;
  local_40 = uVar14;
  if (bBits < 200) {
    puVar10 = puVar10 + -(ulong)(uVar18 * 2);
    uVar9 = 0;
    puVar10[-1] = 0x197180;
    memset(puVar10,0,(ulong)(uVar18 * 2) * 8);
    puVar17 = ctx_n;
    puVar10[-1] = 0x19718f;
    memcpy(puVar10,puVar17,__n);
    puVar17 = local_38;
    puVar10[-1] = 0x1971a2;
    memcpy(puVar10 + uVar8,puVar17,__n);
    uVar14 = local_40;
    puVar17 = local_60;
    local_38 = puVar10;
    puVar10[-1] = 0x1971bc;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar18,puVar10,uVar14,puVar10 + uVar8,puVar17);
    puVar4 = local_38;
    uVar14 = local_40;
    puVar17 = local_48;
    if ((int)local_70 != 0) {
      do {
        puVar13 = local_60;
        if ((ctx_r2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
          puVar10[-1] = 0x197206;
          Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar4,uVar14,puVar13,puVar17,puVar13);
        }
        puVar10[-1] = 0x19721a;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar4,uVar14,puVar17,puVar17);
        uVar15 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar15;
      } while ((uint)local_70 != uVar15);
    }
  }
  else {
    t11._4_4_ = bBits - 1 >> 6;
    local_68 = (uint64_t *)(ulong)(uVar18 * 2);
    sVar1 = (long)local_68 * 8;
    puVar10 = puVar10 + -(long)local_68;
    local_58 = puVar10;
    puVar10[-1] = 0x19725c;
    memset(puVar10,0,sVar1);
    puVar17 = ctx_n;
    puVar10[-1] = 0x19726b;
    memcpy(puVar10,puVar17,__n);
    puVar17 = local_38;
    local_98 = puVar10 + uVar8;
    puVar10[-1] = 0x197282;
    memcpy(puVar10 + uVar8,puVar17,__n);
    local_d0 = (ulong)(uVar18 << 4);
    sVar1 = local_d0 * 8;
    puVar10 = puVar10 + -local_d0;
    puVar10[-1] = 0x1972aa;
    memset(puVar10,0,sVar1);
    puVar11 = (uint64_t *)((long)puVar10 - uVar9);
    local_88 = uVar9;
    puVar11[-1] = 0x1972c4;
    memset(puVar11,0,__n);
    uVar14 = local_40;
    puVar4 = local_58;
    puVar17 = local_98;
    ctx_n = puVar10;
    local_38 = (uint64_t *)__n;
    puVar11[-1] = 0x1972f0;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar18,puVar4,uVar14,puVar17,puVar10);
    puVar13 = local_38;
    puVar17 = local_48;
    puVar11[-1] = 0x197300;
    memcpy(puVar10 + uVar8,puVar17,(size_t)puVar13);
    puVar11[-1] = 0x197317;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar4,uVar14,puVar10 + uVar8,puVar11);
    puVar17 = local_38;
    puVar10 = ctx_n + (long)local_68;
    puVar11[-1] = 0x197332;
    memcpy(puVar10,puVar11,(size_t)puVar17);
    puVar4 = local_48;
    puVar17 = local_58;
    puVar11[-1] = 0x19734e;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar17,uVar14,puVar4,puVar10,puVar11);
    puVar13 = local_38;
    puVar4 = ctx_n;
    local_c8 = (ulong)(uVar18 * 3);
    puVar12 = ctx_n + local_c8;
    local_80 = puVar12;
    puVar11[-1] = 0x197378;
    memcpy(puVar12,puVar11,(size_t)puVar13);
    uVar14 = local_40;
    puVar11[-1] = 0x197390;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar17,uVar14,puVar10,puVar11);
    puVar10 = local_38;
    local_c0 = (ulong)(uVar18 * 4);
    puVar13 = puVar4 + local_c0;
    t11_2 = puVar13;
    puVar11[-1] = 0x1973c3;
    memcpy(puVar13,puVar11,(size_t)puVar10);
    puVar17 = local_48;
    puVar10 = local_58;
    puVar11[-1] = 0x1973dc;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar10,uVar14,puVar17,puVar13,puVar11);
    puVar17 = local_38;
    t11_1 = (uint64_t *)(ulong)(uVar18 * 5);
    puVar10 = puVar4 + (long)t11_1;
    t11_3 = puVar10;
    puVar11[-1] = 0x1973fe;
    memcpy(puVar10,puVar11,(size_t)puVar17);
    uVar14 = local_40;
    puVar17 = local_58;
    puVar10 = local_80;
    puVar11[-1] = 0x197418;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar17,uVar14,puVar10,puVar11);
    puVar13 = local_38;
    puVar10 = puVar4 + (uint)((int)local_68 * 3);
    local_b8 = puVar10;
    puVar11[-1] = 0x197439;
    memcpy(puVar10,puVar11,(size_t)puVar13);
    uVar14 = local_40;
    puVar13 = local_48;
    puVar11[-1] = 0x197452;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar17,uVar14,puVar13,puVar10,puVar11);
    puVar10 = local_38;
    local_80 = puVar4 + uVar18 * 7;
    puVar11[-1] = 0x197474;
    memcpy(puVar4 + uVar18 * 7,puVar11,(size_t)puVar10);
    uVar14 = local_40;
    puVar10 = t11_2;
    puVar11[-1] = 0x19748d;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar17,uVar14,puVar10,puVar11);
    puVar10 = local_38;
    uVar14 = local_40;
    puVar11[-1] = 0x1974a4;
    memcpy(puVar4 + uVar18 * 8,puVar11,(size_t)puVar10);
    puVar10 = local_48;
    puVar17 = local_58;
    puVar11[-1] = 0x1974c0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64
              (uVar18,puVar17,uVar14,puVar10,puVar4 + uVar18 * 8,puVar11);
    puVar10 = local_38;
    puVar4 = ctx_n;
    puVar13 = ctx_n + uVar18 * 9;
    puVar11[-1] = 0x1974df;
    memcpy(puVar13,puVar11,(size_t)puVar10);
    puVar10 = t11_3;
    puVar11[-1] = 0x1974f7;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar17,uVar14,puVar10,puVar11);
    puVar17 = local_38;
    puVar10 = puVar4 + (uint)((int)local_68 * 5);
    puVar11[-1] = 0x197515;
    memcpy(puVar10,puVar11,(size_t)puVar17);
    puVar13 = local_48;
    puVar17 = local_58;
    puVar11[-1] = 0x19752e;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar17,uVar14,puVar13,puVar10,puVar11);
    puVar10 = local_38;
    iVar2 = (int)t11_1;
    puVar11[-1] = 0x197549;
    memcpy(puVar4 + (uVar18 + iVar2 * 2),puVar11,(size_t)puVar10);
    puVar17 = local_58;
    puVar10 = local_b8;
    puVar11[-1] = 0x197565;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar17,uVar14,puVar10,puVar11);
    puVar4 = local_38;
    puVar10 = ctx_n + (uint)((int)local_c0 * 3);
    puVar11[-1] = 0x197586;
    memcpy(puVar10,puVar11,(size_t)puVar4);
    puVar4 = local_48;
    puVar11[-1] = 0x19759e;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar17,uVar14,puVar4,puVar10,puVar11);
    puVar4 = local_38;
    puVar17 = ctx_n;
    puVar10 = ctx_n + (uVar18 + (int)local_c8 * 4);
    puVar11[-1] = 0x1975bd;
    memcpy(puVar10,puVar11,(size_t)puVar4);
    uVar14 = local_40;
    puVar4 = local_58;
    puVar10 = local_80;
    puVar11[-1] = 0x1975d7;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar18,puVar4,uVar14,puVar10,puVar11);
    puVar13 = local_38;
    puVar10 = puVar17 + (uint)((int)local_d0 - (int)local_68);
    puVar11[-1] = 0x1975f4;
    memcpy(puVar10,puVar11,(size_t)puVar13);
    puVar12 = local_38;
    uVar14 = local_40;
    puVar13 = local_48;
    puVar11[-1] = 0x197611;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar18,puVar4,uVar14,puVar13,puVar10,puVar11);
    uVar3 = local_70;
    iVar2 = (int)t11_1;
    puVar11[-1] = 0x19762e;
    memcpy(puVar17 + (uint)(iVar2 * 3),puVar11,(size_t)puVar12);
    uVar14 = local_40;
    puVar17 = local_60;
    uVar9 = local_88;
    puVar10 = local_98;
    local_48 = (uint64_t *)uVar8;
    if ((uVar3 & 3) == 0) {
      puVar11[-1] = 0x1976ae;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar18,puVar4,uVar14,puVar10,puVar17);
      uVar9 = local_88;
    }
    else {
      uVar8 = uVar3 >> 6 & 0x3ffffff;
      bVar5 = (byte)uVar3 & 0x3c;
      uVar15 = (uint)(ctx_r2[uVar8] >> bVar5);
      if ((uVar3 & 0x3c) != 0 && (uint)uVar8 < t11._4_4_) {
        uVar15 = uVar15 | (uint)(ctx_r2[uVar8 + 1] << (-bVar5 & 0x3f));
      }
      puVar10 = ctx_n + (uVar15 & 0xf) * uVar18;
      puVar11[-1] = 0x197692;
      memcpy(puVar17,puVar10,(size_t)puVar12);
    }
    puVar11 = (uint64_t *)((long)puVar11 - uVar9);
    local_68 = puVar11;
    puVar11[-1] = 0x1976c9;
    memset(puVar11,0,(size_t)puVar12);
    uVar9 = uVar3 >> 2 & 0x3fffffff;
    uVar18 = (uint)uVar3 & 0xfffffffc;
    puVar10 = local_58;
    uVar14 = local_40;
    puVar17 = local_48;
    do {
      puVar4 = local_60;
      uVar18 = uVar18 - 4;
      local_70 = CONCAT44(local_70._4_4_,(int)uVar9);
      uVar16 = (uint32_t)puVar17;
      puVar11[-1] = 0x1976fe;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar16,puVar10,uVar14,puVar4,puVar4);
      puVar11[-1] = 0x197712;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar16,puVar10,uVar14,puVar4,puVar4);
      puVar11[-1] = 0x197726;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar16,puVar10,uVar14,puVar4,puVar4);
      puVar11[-1] = 0x19773a;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar16,puVar10,uVar14,puVar4,puVar4);
      puVar10 = local_38;
      puVar17 = local_48;
      puVar4 = local_68;
      uVar7 = uVar18 >> 6;
      sVar6 = (sbyte)(uVar18 & 0x3c);
      uVar15 = (uint)(ctx_r2[uVar7] >> sVar6);
      if ((uVar18 & 0x3c) != 0 && uVar7 < t11._4_4_) {
        uVar15 = uVar15 | (uint)(ctx_r2[(ulong)uVar7 + 1] << (-sVar6 & 0x3fU));
      }
      uVar16 = (uint32_t)local_48;
      puVar13 = ctx_n + (uVar15 & 0xf) * uVar16;
      puVar11[-1] = 0x197796;
      memcpy(puVar4,puVar13,(size_t)puVar10);
      uVar14 = local_40;
      puVar10 = local_58;
      puVar13 = local_60;
      puVar11[-1] = 0x1977b6;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar16,puVar10,uVar14,puVar13,puVar4,puVar13);
      uVar9 = (ulong)((int)local_70 - 1U);
    } while ((int)local_70 - 1U != 0);
  }
  return;
}

Assistant:

void
Hacl_GenericField64_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *aM,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *resM
)
{
  uint32_t len1 = Hacl_GenericField64_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), k1.len);
  uint64_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint64_t));
  memcpy(aMc, aM, k1.len * sizeof (uint64_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint64_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 64U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len1);
    uint64_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint64_t));
    uint64_t *t0 = table;
    uint64_t *t1 = table + len1;
    uint64_t *ctx_n0 = ctx;
    uint64_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint64_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint64_t *t11 = table + (i + 1U) * len1;
      uint64_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint64_t));
      uint64_t *t2 = table + (2U * i + 2U) * len1;
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint64_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
      uint32_t bits_l32 = (uint32_t)bits_c;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
    }
    else
    {
      uint64_t *ctx_n = ctx;
      uint64_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint64_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint64_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k2, 4U);
      uint32_t bits_l32 = (uint32_t)bits_l;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}